

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::VideoTrack::set_colour_space(VideoTrack *this,char *colour_space)

{
  size_t __n;
  char *pcVar1;
  size_t length;
  char *colour_space_local;
  VideoTrack *this_local;
  
  if (colour_space != (char *)0x0) {
    if (this->colour_space_ != (char *)0x0) {
      operator_delete__(this->colour_space_);
    }
    __n = strlen(colour_space);
    pcVar1 = (char *)operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    this->colour_space_ = pcVar1;
    if (this->colour_space_ != (char *)0x0) {
      memcpy(this->colour_space_,colour_space,__n);
      this->colour_space_[__n] = '\0';
    }
  }
  return;
}

Assistant:

void VideoTrack::set_colour_space(const char* colour_space) {
  if (colour_space) {
    delete[] colour_space_;

    const size_t length = strlen(colour_space) + 1;
    colour_space_ = new (std::nothrow) char[length];  // NOLINT
    if (colour_space_) {
      memcpy(colour_space_, colour_space, length - 1);
      colour_space_[length - 1] = '\0';
    }
  }
}